

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

void __thiscall QFile::QFile(QFile *this,QString *name)

{
  QFilePrivate *this_00;
  
  this_00 = (QFilePrivate *)operator_new(0x1c0);
  QFilePrivate::QFilePrivate(this_00);
  QFileDevice::QFileDevice(&this->super_QFileDevice,(QFileDevicePrivate *)this_00,(QObject *)0x0);
  (this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&PTR_metaObject_00660ec0;
  QString::operator=((QString *)
                     &(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d[5].children,
                     name);
  return;
}

Assistant:

QFile::QFile(const QString &name)
    : QFileDevice(*new QFilePrivate, nullptr)
{
    Q_D(QFile);
    d->fileName = name;
}